

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O1

bool fstk_FindFile(char *path,char **fullPath,size_t *size)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  stat statbuf;
  stat local_c0;
  
  if (*size == 0) {
    *size = 0x40;
    pcVar5 = (char *)realloc(*fullPath,0x40);
    *fullPath = pcVar5;
    if (pcVar5 == (char *)0x0) {
      piVar6 = __errno_location();
      pcVar5 = strerror(*piVar6);
      error("realloc error during include path search: %s\n",pcVar5);
    }
  }
  if (*fullPath != (char *)0x0) {
    uVar8 = 0xffffffffffffffff;
    do {
      pcVar5 = "";
      if (uVar8 != 0xffffffffffffffff) {
        pcVar5 = includePaths[uVar8];
      }
      uVar2 = snprintf(*fullPath,*size,"%s%s",pcVar5,path);
      if ((int)uVar2 < 0) {
        piVar6 = __errno_location();
        pcVar5 = strerror(*piVar6);
        pcVar7 = "snprintf error during include path search: %s\n";
LAB_0010bba6:
        bVar1 = false;
        error(pcVar7,pcVar5);
        iVar3 = 2;
      }
      else {
        if (*size <= (ulong)uVar2) {
          *size = (ulong)(uVar2 + 1);
          pcVar7 = (char *)realloc(*fullPath,(ulong)(uVar2 + 1));
          *fullPath = pcVar7;
          if (pcVar7 == (char *)0x0) {
            piVar6 = __errno_location();
            pcVar5 = strerror(*piVar6);
            pcVar7 = "realloc error during include path search: %s\n";
          }
          else {
            iVar3 = sprintf(pcVar7,"%s%s",pcVar5);
            if (-1 < iVar3) goto LAB_0010bb26;
            piVar6 = __errno_location();
            pcVar5 = strerror(*piVar6);
            pcVar7 = "sprintf error during include path search: %s\n";
          }
          goto LAB_0010bba6;
        }
LAB_0010bb26:
        iVar4 = stat(*fullPath,&local_c0);
        iVar3 = 0;
        bVar1 = true;
        if ((iVar4 == 0) && ((local_c0.st_mode & 0xf000) != 0x4000)) {
          printDep(*fullPath);
          iVar3 = 1;
          bVar1 = false;
        }
      }
      if (!bVar1) goto LAB_0010bbd1;
      uVar8 = uVar8 + 1;
    } while (uVar8 < nbIncPaths);
    iVar3 = 2;
LAB_0010bbd1:
    if (iVar3 != 2) {
      return true;
    }
  }
  piVar6 = __errno_location();
  *piVar6 = 2;
  if (generatedMissingIncludes == true) {
    printDep(path);
  }
  return false;
}

Assistant:

bool fstk_FindFile(char const *path, char **fullPath, size_t *size)
{
	if (!*size) {
		*size = 64; // This is arbitrary, really
		*fullPath = (char *)realloc(*fullPath, *size);
		if (!*fullPath)
			error("realloc error during include path search: %s\n",
			      strerror(errno));
	}

	if (*fullPath) {
		for (size_t i = 0; i <= nbIncPaths; ++i) {
			char const *incPath = i ? includePaths[i - 1] : "";
			int len = snprintf(*fullPath, *size, "%s%s", incPath, path);

			if (len < 0) {
				error("snprintf error during include path search: %s\n",
				      strerror(errno));
				break;
			}

			// Oh how I wish `asnprintf` was standard...
			if ((size_t)len >= *size) { // `size` includes the terminator, `len` doesn't
				*size = len + 1;
				*fullPath = (char *)realloc(*fullPath, *size);
				if (!*fullPath) {
					error("realloc error during include path search: %s\n",
					      strerror(errno));
					break;
				}
				len = sprintf(*fullPath, "%s%s", incPath, path);
				if (len < 0) {
					error("sprintf error during include path search: %s\n",
					       strerror(errno));
					break;
				}
			}

			if (isPathValid(*fullPath)) {
				printDep(*fullPath);
				return true;
			}
		}
	}

	errno = ENOENT;
	if (generatedMissingIncludes)
		printDep(path);
	return false;
}